

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVBufferManager::GetFilePath_abi_cxx11_
          (string *__return_storage_ptr__,CSVBufferManager *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->file);
  return __return_storage_ptr__;
}

Assistant:

string CSVBufferManager::GetFilePath() const {
	return file.path;
}